

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O0

void pp_crypto_hash_sha2_512_process(PHashSHA2_512 *ctx,puint64 *data)

{
  long lVar1;
  ulong uVar2;
  uint local_2ec;
  ulong uStack_2e8;
  puint i;
  puint64 A [8];
  puint64 W [80];
  puint64 tmp_sum2;
  puint64 tmp_sum1;
  puint64 *data_local;
  PHashSHA2_512 *ctx_local;
  
  for (local_2ec = 0; local_2ec < 8; local_2ec = local_2ec + 1) {
    A[(ulong)local_2ec - 1] = ctx->hash[local_2ec];
  }
  memcpy(A + 7,data,0x80);
  for (local_2ec = 0x10; local_2ec < 0x50; local_2ec = local_2ec + 1) {
    A[(ulong)local_2ec + 7] =
         ((A[(ulong)(local_2ec - 2) + 7] >> 0x13 | A[(ulong)(local_2ec - 2) + 7] << 0x2d) ^
          (A[(ulong)(local_2ec - 2) + 7] >> 0x3d | A[(ulong)(local_2ec - 2) + 7] << 3) ^
         A[(ulong)(local_2ec - 2) + 7] >> 6) + A[(ulong)(local_2ec - 7) + 7] +
         ((A[(ulong)(local_2ec - 0xf) + 7] >> 1 | A[(ulong)(local_2ec - 0xf) + 7] << 0x3f) ^
          (A[(ulong)(local_2ec - 0xf) + 7] >> 8 | A[(ulong)(local_2ec - 0xf) + 7] << 0x38) ^
         A[(ulong)(local_2ec - 0xf) + 7] >> 7) + A[(ulong)(local_2ec - 0x10) + 7];
  }
  for (local_2ec = 0; local_2ec < 0x50; local_2ec = local_2ec + 8) {
    lVar1 = A[6] + ((A[3] >> 0xe | A[3] << 0x32) ^ (A[3] >> 0x12 | A[3] << 0x2e) ^
                   (A[3] >> 0x29 | A[3] << 0x17)) + (A[5] ^ A[3] & (A[4] ^ A[5])) +
            pp_crypto_hash_sha2_512_K[local_2ec] + A[(ulong)local_2ec + 7];
    A[2] = lVar1 + A[2];
    A[6] = lVar1 + ((uStack_2e8 >> 0x1c | uStack_2e8 << 0x24) ^
                    (uStack_2e8 >> 0x22 | uStack_2e8 << 0x1e) ^
                   (uStack_2e8 >> 0x27 | uStack_2e8 << 0x19)) +
                   (uStack_2e8 & A[0] | A[1] & (uStack_2e8 | A[0]));
    lVar1 = A[5] + ((A[2] >> 0xe | A[2] << 0x32) ^ (A[2] >> 0x12 | A[2] << 0x2e) ^
                   (A[2] >> 0x29 | A[2] * 0x800000)) + (A[4] ^ A[2] & (A[3] ^ A[4])) +
            pp_crypto_hash_sha2_512_K[local_2ec + 1] + A[(ulong)(local_2ec + 1) + 7];
    A[1] = lVar1 + A[1];
    A[5] = lVar1 + ((A[6] >> 0x1c | A[6] << 0x24) ^ (A[6] >> 0x22 | A[6] * 0x40000000) ^
                   (A[6] >> 0x27 | A[6] * 0x2000000)) +
                   (A[6] & uStack_2e8 | A[0] & (A[6] | uStack_2e8));
    lVar1 = A[4] + ((A[1] >> 0xe | A[1] << 0x32) ^ (A[1] >> 0x12 | A[1] << 0x2e) ^
                   (A[1] >> 0x29 | A[1] * 0x800000)) + (A[3] ^ A[1] & (A[2] ^ A[3])) +
            pp_crypto_hash_sha2_512_K[local_2ec + 2] + A[(ulong)(local_2ec + 2) + 7];
    A[0] = lVar1 + A[0];
    A[4] = lVar1 + ((A[5] >> 0x1c | A[5] << 0x24) ^ (A[5] >> 0x22 | A[5] * 0x40000000) ^
                   (A[5] >> 0x27 | A[5] * 0x2000000)) + (A[5] & A[6] | uStack_2e8 & (A[5] | A[6]));
    lVar1 = A[3] + ((A[0] >> 0xe | A[0] << 0x32) ^ (A[0] >> 0x12 | A[0] << 0x2e) ^
                   (A[0] >> 0x29 | A[0] * 0x800000)) + (A[2] ^ A[0] & (A[1] ^ A[2])) +
            pp_crypto_hash_sha2_512_K[local_2ec + 3] + A[(ulong)(local_2ec + 3) + 7];
    uVar2 = lVar1 + uStack_2e8;
    A[3] = lVar1 + ((A[4] >> 0x1c | A[4] << 0x24) ^ (A[4] >> 0x22 | A[4] * 0x40000000) ^
                   (A[4] >> 0x27 | A[4] * 0x2000000)) + (A[4] & A[5] | A[6] & (A[4] | A[5]));
    lVar1 = A[2] + ((uVar2 >> 0xe | uVar2 << 0x32) ^ (uVar2 >> 0x12 | uVar2 << 0x2e) ^
                   (uVar2 >> 0x29 | uVar2 * 0x800000)) + (A[1] ^ uVar2 & (A[0] ^ A[1])) +
            pp_crypto_hash_sha2_512_K[local_2ec + 4] + A[(ulong)(local_2ec + 4) + 7];
    A[6] = lVar1 + A[6];
    A[2] = lVar1 + ((A[3] >> 0x1c | A[3] << 0x24) ^ (A[3] >> 0x22 | A[3] * 0x40000000) ^
                   (A[3] >> 0x27 | A[3] * 0x2000000)) + (A[3] & A[4] | A[5] & (A[3] | A[4]));
    lVar1 = A[1] + ((A[6] >> 0xe | A[6] << 0x32) ^ (A[6] >> 0x12 | A[6] << 0x2e) ^
                   (A[6] >> 0x29 | A[6] * 0x800000)) + (A[0] ^ A[6] & (uVar2 ^ A[0])) +
            pp_crypto_hash_sha2_512_K[local_2ec + 5] + A[(ulong)(local_2ec + 5) + 7];
    A[5] = lVar1 + A[5];
    A[1] = lVar1 + ((A[2] >> 0x1c | A[2] << 0x24) ^ (A[2] >> 0x22 | A[2] * 0x40000000) ^
                   (A[2] >> 0x27 | A[2] * 0x2000000)) + (A[2] & A[3] | A[4] & (A[2] | A[3]));
    lVar1 = A[0] + ((A[5] >> 0xe | A[5] << 0x32) ^ (A[5] >> 0x12 | A[5] << 0x2e) ^
                   (A[5] >> 0x29 | A[5] * 0x800000)) + (uVar2 ^ A[5] & (A[6] ^ uVar2)) +
            pp_crypto_hash_sha2_512_K[local_2ec + 6] + A[(ulong)(local_2ec + 6) + 7];
    A[4] = lVar1 + A[4];
    A[0] = lVar1 + ((A[1] >> 0x1c | A[1] << 0x24) ^ (A[1] >> 0x22 | A[1] * 0x40000000) ^
                   (A[1] >> 0x27 | A[1] * 0x2000000)) + (A[1] & A[2] | A[3] & (A[1] | A[2]));
    lVar1 = uVar2 + ((A[4] >> 0xe | A[4] << 0x32) ^ (A[4] >> 0x12 | A[4] << 0x2e) ^
                    (A[4] >> 0x29 | A[4] * 0x800000)) + (A[6] ^ A[4] & (A[5] ^ A[6])) +
            pp_crypto_hash_sha2_512_K[local_2ec + 7] + A[(ulong)(local_2ec + 7) + 7];
    A[3] = lVar1 + A[3];
    uStack_2e8 = lVar1 + ((A[0] >> 0x1c | A[0] << 0x24) ^ (A[0] >> 0x22 | A[0] * 0x40000000) ^
                         (A[0] >> 0x27 | A[0] * 0x2000000)) + (A[0] & A[1] | A[2] & (A[0] | A[1]));
  }
  for (local_2ec = 0; local_2ec < 8; local_2ec = local_2ec + 1) {
    ctx->hash[local_2ec] = A[(ulong)local_2ec - 1] + ctx->hash[local_2ec];
  }
  return;
}

Assistant:

static void
pp_crypto_hash_sha2_512_process (PHashSHA2_512	*ctx,
				 const puint64	data[16])
{
	puint64	tmp_sum1;
	puint64	tmp_sum2;
	puint64 W[80];
	puint64	A[8];
	puint	i;

	for (i = 0; i < 8; ++i)
		A[i] = ctx->hash[i];

	memcpy (W, data, 128);

	for (i = 16; i < 80; ++i)
		W[i] = P_SHA2_512_S1 (W[i -  2]) + W[i -  7] + P_SHA2_512_S0 (W[i - 15]) + W[i - 16];

	for (i = 0; i < 80; i += 8) {
		P_SHA2_512_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i + 0], pp_crypto_hash_sha2_512_K[i + 0])
		P_SHA2_512_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i + 1], pp_crypto_hash_sha2_512_K[i + 1])
		P_SHA2_512_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i + 2], pp_crypto_hash_sha2_512_K[i + 2])
		P_SHA2_512_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i + 3], pp_crypto_hash_sha2_512_K[i + 3])
		P_SHA2_512_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i + 4], pp_crypto_hash_sha2_512_K[i + 4])
		P_SHA2_512_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i + 5], pp_crypto_hash_sha2_512_K[i + 5])
		P_SHA2_512_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i + 6], pp_crypto_hash_sha2_512_K[i + 6])
		P_SHA2_512_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i + 7], pp_crypto_hash_sha2_512_K[i + 7])
	}

	for (i = 0; i < 8; ++i)
		ctx->hash[i] += A[i];
}